

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

void os_rand(long *val)

{
  int iVar1;
  result_type rVar2;
  result_type *in_RDI;
  result_type in_stack_ffffffffffffffe8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *in_stack_fffffffffffffff0;
  
  if (os_rand::rdev == '\0') {
    iVar1 = __cxa_guard_acquire(&os_rand::rdev);
    if (iVar1 != 0) {
      time((time_t *)0x0);
      std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
      linear_congruential_engine(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
      __cxa_guard_release(&os_rand::rdev);
    }
  }
  rVar2 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::operator()
                    (in_stack_fffffffffffffff0);
  *in_RDI = rVar2;
  return;
}

Assistant:

void
os_rand( long* val )
{
    static std::default_random_engine rdev(time(0));
    *val = rdev();
}